

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmJmp<(moira::Instr)65,(moira::Mode)10,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *this_00;
  Ea<(moira::Mode)10,_(moira::Size)4> src;
  Ea<(moira::Mode)10,_(moira::Size)4> local_2c;
  
  Op<(moira::Mode)10,(moira::Size)4>(&local_2c,this,op & 7,addr);
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00,(Align)(this->tab).raw);
  StrWriter::operator<<(this_00,&local_2c);
  return;
}

Assistant:

void
Moira::dasmJmp(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << tab << src;
}